

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O2

bool __thiscall
hwtest::pgraph::anon_unknown_2::ScanTest::test_read(ScanTest *this,uint32_t reg,uint32_t exp)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)nva_cards[(this->super_Test).cnum]->bar0 + (ulong)reg);
  if (uVar1 != exp) {
    printf("Read mismatch for %06x: is %08x, expected %08x\n",reg,(ulong)uVar1,(ulong)exp);
    this->res = 3;
  }
  return uVar1 != exp;
}

Assistant:

bool test_read(uint32_t reg, uint32_t exp) {
		uint32_t real = nva_rd32(cnum, reg);
		if (exp != real) {
			printf("Read mismatch for %06x: is %08x, expected %08x\n", reg, real, exp);
			res = HWTEST_RES_FAIL;
			return true;
		}
		return false;
	}